

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O2

void SimpleBVH::point_segment_squared_distance
               (VectorMax3d *point,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *f,
               VectorMax3d *closest_point,double *dist)

{
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *pMVar1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *other_00;
  ReturnType RVar2;
  RealScalar RVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_128;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_88;
  double local_58;
  double lambda1;
  double lambda0;
  RealScalar local_40;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *local_38;
  
  other = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)(f->_M_elems + 1);
  lambda0 = (double)dist;
  local_38 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)closest_point;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&local_f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)f,other);
  local_40 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
             ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                            *)&local_f8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&local_f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)point,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&local_88,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)other,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
          ::
          dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                    ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                      *)&local_f8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                      *)&local_88);
  other_00 = local_38;
  pMVar1 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)f;
  if ((((local_40 == 0.0) && (!NAN(local_40))) || (RVar2 <= 0.0)) ||
     (pMVar1 = other, local_40 < RVar2)) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::Matrix<double,_1,1,0,3,1>>
              ((Matrix<double,__1,_1,_0,_3,_1> *)local_38,(Matrix<double,__1,_1,_0,_3,_1> *)pMVar1);
  }
  else {
    local_58 = RVar2 / local_40;
    lambda1 = 1.0 - local_58;
    Eigen::operator*(&local_88,&lambda1,(StorageBaseType *)f);
    Eigen::operator*(&local_128,&local_58,other);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,3,1>const>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
    ::operator+(&local_f8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                 *)&local_88,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                 *)&local_128);
    other_00 = local_38;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
              ((Matrix<double,__1,_1,_0,_3,_1> *)local_38,&local_f8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&local_f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)point,other_00);
  RVar3 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&local_f8);
  *(RealScalar *)lambda0 = RVar3;
  return;
}

Assistant:

void point_segment_squared_distance(
    const VectorMax3d& point,
    const std::array<VectorMax3d, 2>& f,
    VectorMax3d& closest_point,
    double& dist)
{
    const double l2 = (f[0] - f[1]).squaredNorm();
    const double t = (point - f[0]).dot(f[1] - f[0]);
    if (t <= 0.0 || l2 == 0.0) {
        closest_point = f[0];
    } else if (t > l2) {
        closest_point = f[1];
    } else {
        const double lambda1 = t / l2;
        const double lambda0 = 1.0 - lambda1;
        closest_point = lambda0 * f[0] + lambda1 * f[1];
    }
    dist = (point - closest_point).squaredNorm();
}